

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StructColumnReader::Read
          (StructColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result)

{
  int iVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  reference this_02;
  type this_03;
  pointer pCVar2;
  undefined4 extraout_var;
  idx_t iVar3;
  runtime_error *this_04;
  InternalException *this_05;
  idx_t i;
  ulong uVar4;
  optional_idx local_78;
  uint64_t local_70;
  optional_idx read_count;
  
  this_00 = StructVector::GetEntries(result);
  if ((this->super_ColumnReader).pending_skips != 0) {
    this_05 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&read_count,"StructColumnReader cannot have pending skips",
               (allocator *)&local_78);
    InternalException::InternalException(this_05,(string *)&read_count);
    __cxa_throw(this_05,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  read_count.index = ((this->super_ColumnReader).column_schema)->max_define;
  local_70 = num_values;
  ::std::__fill_n_a<unsigned_char*,unsigned_long,unsigned_long>(define_out,num_values,&read_count);
  read_count.index = 0xffffffffffffffff;
  uVar4 = 0;
  do {
    if ((ulong)((long)(this->child_readers).
                      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->child_readers).
                      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) {
      if (read_count.index == 0xffffffffffffffff) {
        optional_idx::optional_idx(&local_78,local_70);
        read_count.index = local_78.index;
      }
      FlatVector::VerifyFlatVector(result);
      uVar4 = 0;
      while( true ) {
        iVar3 = optional_idx::GetIndex(&read_count);
        if (iVar3 <= uVar4) break;
        if ((ulong)define_out[uVar4] < ((this->super_ColumnReader).column_schema)->max_define) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar4);
        }
        uVar4 = uVar4 + 1;
      }
      iVar3 = optional_idx::GetIndex(&read_count);
      return iVar3;
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
              ::get<true>(&this->child_readers,uVar4);
    this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_00,uVar4);
    this_03 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (this_02);
    if ((this_01->super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
        super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl == (ColumnReader *)0x0) {
      Vector::SetVectorType(this_03,CONSTANT_VECTOR);
      ConstantVector::SetNull(this_03,true);
    }
    else {
      pCVar2 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(this_01);
      iVar1 = (*pCVar2->_vptr_ColumnReader[3])(pCVar2,local_70,define_out,repeat_out,this_03);
      if (read_count.index == 0xffffffffffffffff) {
        optional_idx::optional_idx(&local_78,CONCAT44(extraout_var,iVar1));
        read_count.index = local_78.index;
      }
      else {
        iVar3 = optional_idx::GetIndex(&read_count);
        if (iVar3 != CONCAT44(extraout_var,iVar1)) {
          this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(this_04,"Struct child row count mismatch");
          __cxa_throw(this_04,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

idx_t StructColumnReader::Read(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	auto &struct_entries = StructVector::GetEntries(result);
	D_ASSERT(StructType::GetChildTypes(Type()).size() == struct_entries.size());

	if (pending_skips > 0) {
		throw InternalException("StructColumnReader cannot have pending skips");
	}

	// If the child reader values are all valid, "define_out" may not be initialized at all
	// So, we just initialize them to all be valid beforehand
	std::fill_n(define_out, num_values, MaxDefine());

	optional_idx read_count;
	for (idx_t i = 0; i < child_readers.size(); i++) {
		auto &child = child_readers[i];
		auto &target_vector = *struct_entries[i];
		if (!child) {
			// if we are not scanning this vector - set it to NULL
			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
			continue;
		}
		auto child_num_values = child->Read(num_values, define_out, repeat_out, target_vector);
		if (!read_count.IsValid()) {
			read_count = child_num_values;
		} else if (read_count.GetIndex() != child_num_values) {
			throw std::runtime_error("Struct child row count mismatch");
		}
	}
	if (!read_count.IsValid()) {
		read_count = num_values;
	}
	// set the validity mask for this level
	auto &validity = FlatVector::Validity(result);
	for (idx_t i = 0; i < read_count.GetIndex(); i++) {
		if (define_out[i] < MaxDefine()) {
			validity.SetInvalid(i);
		}
	}

	return read_count.GetIndex();
}